

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  char cVar1;
  _Alloc_hider *p_Var2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Column *pCVar6;
  iterator *this_00;
  
  uVar4 = this->m_pos + this->m_len;
  this->m_pos = uVar4;
  pCVar6 = this->m_column;
  uVar5 = this->m_stringIndex;
  this_00 = (iterator *)
            (pCVar6->m_strings).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (&this_00->m_stringIndex)[uVar5 * 4]) {
    p_Var2 = (_Alloc_hider *)&this_00->m_column + uVar5 * 4;
    if (p_Var2->_M_p[uVar4] == '\n') {
      uVar4 = uVar4 + 1;
      this->m_pos = uVar4;
    }
    else {
      do {
        cVar1 = p_Var2->_M_p[uVar4];
        if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
          operator++(this_00);
        }
        lVar3 = ::std::__cxx11::string::find('8',(ulong)(uint)(int)cVar1);
        uVar4 = this->m_pos;
        pCVar6 = this->m_column;
        uVar5 = this->m_stringIndex;
        this_00 = (iterator *)
                  (pCVar6->m_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (lVar3 == -1) break;
        uVar4 = uVar4 + 1;
        this->m_pos = uVar4;
        p_Var2 = (_Alloc_hider *)&this_00->m_column + uVar5 * 4;
      } while (uVar4 < (&this_00->m_stringIndex)[uVar5 * 4]);
    }
  }
  if (uVar4 == (&this_00->m_stringIndex)[uVar5 * 4]) {
    this->m_pos = 0;
    uVar5 = uVar5 + 1;
    this->m_stringIndex = uVar5;
  }
  if (uVar5 < (ulong)((long)(pCVar6->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 5)) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}